

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpainterpath.cpp
# Opt level: O3

void __thiscall QPainterPath::addEllipse(QPainterPath *this,QRectF *boundingRect)

{
  undefined1 *puVar1;
  ulong uVar2;
  QPainterPathPrivate *pQVar3;
  QRectF r;
  bool bVar4;
  long in_FS_OFFSET;
  int point_count;
  undefined8 in_stack_fffffffffffffee8;
  QPointF in_stack_fffffffffffffef0;
  int local_fc;
  QPointF local_f8;
  QPointF local_e8;
  QPointF local_d8;
  QPointF local_c8;
  QPointF local_b8;
  QPointF local_a8;
  QPointF local_98;
  QPointF local_88;
  QPointF local_78;
  QPointF local_68;
  QPointF local_58;
  QPointF local_48;
  long local_30;
  
  local_30 = *(long *)(in_FS_OFFSET + 0x28);
  r.yp = (qreal)in_stack_fffffffffffffee8;
  r.xp = boundingRect->h;
  r._16_16_ = in_stack_fffffffffffffef0;
  bVar4 = hasValidCoords(r);
  if ((bVar4) &&
     ((((boundingRect->w != 0.0 || (NAN(boundingRect->w))) || (boundingRect->h != 0.0)) ||
      (NAN(boundingRect->h))))) {
    if ((this->d_ptr).d.ptr == (QPainterPathPrivate *)0x0) {
      ensureData_helper(this);
    }
    detach(this);
    uVar2 = (((this->d_ptr).d.ptr)->elements).d.size;
    memset(&local_f8,0,0xc0);
    local_fc = -0x55555556;
    qt_curves_for_arc(boundingRect,0.0,-360.0,&local_f8,&local_fc);
    moveTo(this,(QPointF *)&stack0xfffffffffffffef0);
    cubicTo(this,&local_f8,&local_e8,&local_d8);
    cubicTo(this,&local_c8,&local_b8,&local_a8);
    cubicTo(this,&local_98,&local_88,&local_78);
    cubicTo(this,&local_68,&local_58,&local_48);
    puVar1 = &((this->d_ptr).d.ptr)->field_0x84;
    *puVar1 = *puVar1 | 1;
    pQVar3 = (this->d_ptr).d.ptr;
    pQVar3->field_0x84 = pQVar3->field_0x84 & 0xef | (uVar2 < 2) << 4;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_30) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPainterPath::addEllipse(const QRectF &boundingRect)
{
    if (!hasValidCoords(boundingRect)) {
#ifndef QT_NO_DEBUG
        qWarning("QPainterPath::addEllipse: Adding point with invalid coordinates, ignoring call");
#endif
        return;
    }

    if (boundingRect.isNull())
        return;

    ensureData();
    detach();

    bool first = d_func()->elements.size() < 2;

    QPointF pts[12];
    int point_count;
    QPointF start = qt_curves_for_arc(boundingRect, 0, -360, pts, &point_count);

    moveTo(start);
    cubicTo(pts[0], pts[1], pts[2]);           // 0 -> 270
    cubicTo(pts[3], pts[4], pts[5]);           // 270 -> 180
    cubicTo(pts[6], pts[7], pts[8]);           // 180 -> 90
    cubicTo(pts[9], pts[10], pts[11]);         // 90 - >0
    d_func()->require_moveTo = true;

    d_func()->convex = first;
}